

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_struct_size_msl
          (CompilerMSL *this,SPIRType *struct_type,bool ignore_alignment,bool ignore_padding)

{
  size_t sVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  undefined3 in_register_00000009;
  uint uVar5;
  uint32_t i;
  uint32_t uVar6;
  
  if (CONCAT31(in_register_00000009,ignore_padding) == 0) {
    bVar2 = Compiler::has_extended_decoration
                      ((Compiler *)this,(struct_type->super_IVariant).self.id,
                       SPIRVCrossDecorationPaddingTarget);
    if (bVar2) {
      uVar3 = Compiler::get_extended_decoration
                        ((Compiler *)this,(struct_type->super_IVariant).self.id,
                         SPIRVCrossDecorationPaddingTarget);
      return uVar3;
    }
  }
  sVar1 = (struct_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
          .buffer_size;
  if (sVar1 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (uint32_t)sVar1;
    uVar5 = 1;
    if (uVar3 != 0 && !ignore_alignment) {
      uVar6 = 0;
      do {
        uVar4 = get_declared_struct_member_alignment_msl(this,struct_type,uVar6);
        if (uVar5 <= uVar4) {
          uVar5 = uVar4;
        }
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
    uVar6 = Compiler::type_struct_member_offset((Compiler *)this,struct_type,uVar3 - 1);
    uVar3 = get_declared_struct_member_size_msl(this,struct_type,uVar3 - 1);
    uVar3 = -uVar5 & (uVar3 + uVar6 + uVar5) - 1;
  }
  return uVar3;
}

Assistant:

uint32_t CompilerMSL::get_declared_struct_size_msl(const SPIRType &struct_type, bool ignore_alignment,
                                                   bool ignore_padding) const
{
	// If we have a target size, that is the declared size as well.
	if (!ignore_padding && has_extended_decoration(struct_type.self, SPIRVCrossDecorationPaddingTarget))
		return get_extended_decoration(struct_type.self, SPIRVCrossDecorationPaddingTarget);

	if (struct_type.member_types.empty())
		return 0;

	uint32_t mbr_cnt = uint32_t(struct_type.member_types.size());

	// In MSL, a struct's alignment is equal to the maximum alignment of any of its members.
	uint32_t alignment = 1;

	if (!ignore_alignment)
	{
		for (uint32_t i = 0; i < mbr_cnt; i++)
		{
			uint32_t mbr_alignment = get_declared_struct_member_alignment_msl(struct_type, i);
			alignment = max(alignment, mbr_alignment);
		}
	}

	// Last member will always be matched to the final Offset decoration, but size of struct in MSL now depends
	// on physical size in MSL, and the size of the struct itself is then aligned to struct alignment.
	uint32_t spirv_offset = type_struct_member_offset(struct_type, mbr_cnt - 1);
	uint32_t msl_size = spirv_offset + get_declared_struct_member_size_msl(struct_type, mbr_cnt - 1);
	msl_size = (msl_size + alignment - 1) & ~(alignment - 1);
	return msl_size;
}